

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void PathBezierCubicCurveToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float x4,float y4,float tess_tol,int level)

{
  undefined1 auVar1 [16];
  float x3_00;
  float y3_00;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImVec2 local_18;
  
  while( true ) {
    fVar2 = x4 - x1;
    fVar3 = y4 - y1;
    fVar4 = (x2 - x4) * fVar3 - fVar2 * (y2 - y4);
    fVar5 = (x3 - x4) * fVar3 - fVar2 * (y3 - y4);
    auVar6._0_4_ = -fVar4;
    auVar6._4_4_ = 0x80000000;
    auVar6._8_4_ = 0x80000000;
    auVar6._12_4_ = 0x80000000;
    auVar1 = vcmpss_avx(auVar6,ZEXT416((uint)fVar4),2);
    auVar1 = vblendvps_avx(auVar6,ZEXT416((uint)fVar4),auVar1);
    auVar7._0_4_ = -fVar5;
    auVar7._4_4_ = 0x80000000;
    auVar7._8_4_ = 0x80000000;
    auVar7._12_4_ = 0x80000000;
    auVar6 = vcmpss_avx(auVar7,ZEXT416((uint)fVar5),2);
    auVar6 = vblendvps_avx(auVar7,ZEXT416((uint)fVar5),auVar6);
    fVar4 = auVar1._0_4_ + auVar6._0_4_;
    if (fVar4 * fVar4 < tess_tol * (fVar2 * fVar2 + fVar3 * fVar3)) {
      local_18.x = x4;
      local_18.y = y4;
      ImVector<ImVec2>::push_back(path,&local_18);
      return;
    }
    if (9 < level) break;
    fVar4 = (x2 + x1) * 0.5;
    fVar2 = (y2 + y1) * 0.5;
    fVar3 = (x2 + x3) * 0.5;
    fVar5 = (y2 + y3) * 0.5;
    x3 = (x4 + x3) * 0.5;
    y3 = (y4 + y3) * 0.5;
    x3_00 = (fVar4 + fVar3) * 0.5;
    y3_00 = (fVar2 + fVar5) * 0.5;
    x2 = (x3 + fVar3) * 0.5;
    y2 = (y3 + fVar5) * 0.5;
    fVar3 = (x2 + x3_00) * 0.5;
    fVar5 = (y3_00 + y2) * 0.5;
    level = level + 1;
    PathBezierCubicCurveToCasteljau(path,x1,y1,fVar4,fVar2,x3_00,y3_00,fVar3,fVar5,tess_tol,level);
    x1 = fVar3;
    y1 = fVar5;
  }
  return;
}

Assistant:

static void PathBezierCubicCurveToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = (x2 - x4) * dy - (y2 - y4) * dx;
    float d3 = (x3 - x4) * dy - (y3 - y4) * dx;
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2 + d3) * (d2 + d3) < tess_tol * (dx * dx + dy * dy))
    {
        path->push_back(ImVec2(x4, y4));
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2) * 0.5f, y12 = (y1 + y2) * 0.5f;
        float x23 = (x2 + x3) * 0.5f, y23 = (y2 + y3) * 0.5f;
        float x34 = (x3 + x4) * 0.5f, y34 = (y3 + y4) * 0.5f;
        float x123 = (x12 + x23) * 0.5f, y123 = (y12 + y23) * 0.5f;
        float x234 = (x23 + x34) * 0.5f, y234 = (y23 + y34) * 0.5f;
        float x1234 = (x123 + x234) * 0.5f, y1234 = (y123 + y234) * 0.5f;
        PathBezierCubicCurveToCasteljau(path, x1, y1, x12, y12, x123, y123, x1234, y1234, tess_tol, level + 1);
        PathBezierCubicCurveToCasteljau(path, x1234, y1234, x234, y234, x34, y34, x4, y4, tess_tol, level + 1);
    }
}